

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_test.cc
# Opt level: O1

void * worker(void *voidargs)

{
  int iVar1;
  
  iVar1 = 10000;
  do {
    LOCK();
    **voidargs = **voidargs + 1;
    UNLOCK();
    LOCK();
    **voidargs = **voidargs + -1;
    UNLOCK();
    LOCK();
    **voidargs = **voidargs + 10;
    UNLOCK();
    LOCK();
    **voidargs = **voidargs + -10;
    UNLOCK();
    LOCK();
    **(int **)((long)voidargs + 8) = **(int **)((long)voidargs + 8) + 1;
    UNLOCK();
    LOCK();
    **(int **)((long)voidargs + 8) = **(int **)((long)voidargs + 8) + -1;
    UNLOCK();
    LOCK();
    **(int **)((long)voidargs + 8) = **(int **)((long)voidargs + 8) + 5;
    UNLOCK();
    LOCK();
    **(int **)((long)voidargs + 8) = **(int **)((long)voidargs + 8) + -5;
    UNLOCK();
    LOCK();
    **(short **)((long)voidargs + 0x10) = **(short **)((long)voidargs + 0x10) + 1;
    UNLOCK();
    LOCK();
    **(short **)((long)voidargs + 0x10) = **(short **)((long)voidargs + 0x10) + -1;
    UNLOCK();
    LOCK();
    **(short **)((long)voidargs + 0x10) = **(short **)((long)voidargs + 0x10) + 3;
    UNLOCK();
    LOCK();
    **(short **)((long)voidargs + 0x10) = **(short **)((long)voidargs + 0x10) + -3;
    UNLOCK();
    LOCK();
    **(char **)((long)voidargs + 0x18) = **(char **)((long)voidargs + 0x18) + '\x01';
    UNLOCK();
    LOCK();
    **(char **)((long)voidargs + 0x18) = **(char **)((long)voidargs + 0x18) + -1;
    UNLOCK();
    LOCK();
    **(char **)((long)voidargs + 0x18) = **(char **)((long)voidargs + 0x18) + '\x01';
    UNLOCK();
    LOCK();
    **(char **)((long)voidargs + 0x18) = **(char **)((long)voidargs + 0x18) + -1;
    UNLOCK();
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  pthread_exit((void *)0x0);
}

Assistant:

void * worker(void *voidargs)
{
    struct worker_args *args = (struct worker_args*)voidargs;
    int i = 0;
    int64_t delta_64 = 10;
    int32_t delta_32 = 5;
    int16_t delta_16 = 3;
    int8_t delta_8 = 1;

    for (; i < 10000; ++i) {
        atomic_incr_uint64_t(args->counter_64);
        atomic_decr_uint64_t(args->counter_64);
        atomic_add_uint64_t(args->counter_64, delta_64);
        atomic_sub_uint64_t(args->counter_64, delta_64);

        atomic_incr_uint32_t(args->counter_32);
        atomic_decr_uint32_t(args->counter_32);
        atomic_add_uint32_t(args->counter_32, delta_32);
        atomic_sub_uint32_t(args->counter_32, delta_32);

        atomic_incr_uint16_t(args->counter_16);
        atomic_decr_uint16_t(args->counter_16);
        atomic_add_uint16_t(args->counter_16, delta_16);
        atomic_sub_uint16_t(args->counter_16, delta_16);

        atomic_incr_uint8_t(args->counter_8);
        atomic_decr_uint8_t(args->counter_8);
        atomic_add_uint8_t(args->counter_8, delta_8);
        atomic_sub_uint8_t(args->counter_8, delta_8);
    }

    thread_exit(0);
    return NULL;
}